

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

Statement * __thiscall
slang::ast::StatementBlockSymbol::getStatement
          (StatementBlockSymbol *this,ASTContext *parentContext,StatementContext *stmtCtx)

{
  SyntaxNode *syntax;
  pointer ppSVar1;
  size_type sVar2;
  size_type sVar3;
  Compilation *compilation;
  Statement *pSVar4;
  StatementBlockSymbol *local_70;
  ASTContext local_68;
  
  pSVar4 = this->stmt;
  if (pSVar4 == (Statement *)0x0) {
    Scope::ensureElaborated(&this->super_Scope);
    pSVar4 = this->stmt;
    if (pSVar4 == (Statement *)0x0) {
      syntax = (this->super_Symbol).originatingSyntax;
      if ((syntax == (SyntaxNode *)0x0) || (syntax->kind == RsRule)) {
        compilation = ASTContext::getCompilation(parentContext);
        pSVar4 = BlockStatement::makeEmpty(compilation);
        this->stmt = pSVar4;
      }
      else {
        local_68.assertionInstance = parentContext->assertionInstance;
        local_68.scope.ptr = (parentContext->scope).ptr;
        local_68.lookupIndex = parentContext->lookupIndex;
        local_68._12_4_ = *(undefined4 *)&parentContext->field_0xc;
        local_68.flags.m_bits = (parentContext->flags).m_bits;
        local_68.instanceOrProc = parentContext->instanceOrProc;
        local_68.firstTempVar = parentContext->firstTempVar;
        local_68.randomizeDetails = parentContext->randomizeDetails;
        local_70 = this;
        not_null<slang::ast::Scope_const*>::not_null<slang::ast::StatementBlockSymbol_const*,void>
                  ((not_null<slang::ast::Scope_const*> *)&local_68,&local_70);
        local_68.lookupIndex = 0xffffffff;
        ppSVar1 = (stmtCtx->blocks).data_;
        sVar2 = (stmtCtx->blocks).size_;
        sVar3 = (this->blocks).size_;
        (stmtCtx->blocks).data_ = (this->blocks).data_;
        (stmtCtx->blocks).size_ = sVar3;
        pSVar4 = Statement::bindBlock(this,syntax,&local_68,stmtCtx);
        this->stmt = pSVar4;
        (stmtCtx->blocks).data_ = ppSVar1;
        (stmtCtx->blocks).size_ = sVar2;
        pSVar4 = this->stmt;
      }
    }
  }
  return pSVar4;
}

Assistant:

const Statement& StatementBlockSymbol::getStatement(const ASTContext& parentContext,
                                                    Statement::StatementContext& stmtCtx) const {
    if (!stmt) {
        ensureElaborated();
        if (stmt)
            return *stmt;

        auto syntax = getSyntax();
        if (!syntax || syntax->kind == SyntaxKind::RsRule) {
            stmt = &BlockStatement::makeEmpty(parentContext.getCompilation());
        }
        else {
            ASTContext context = parentContext;
            context.scope = this;
            context.lookupIndex = SymbolIndex(UINT32_MAX);

            auto oldBlocks = std::exchange(stmtCtx.blocks, blocks);
            auto guard = ScopeGuard([&] { stmtCtx.blocks = oldBlocks; });

            stmt = &Statement::bindBlock(*this, *syntax, context, stmtCtx);
        }
    }
    return *stmt;
}